

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMAttrMapImpl::setReadOnly(DOMAttrMapImpl *this,bool readOnl,bool deep)

{
  XMLSize_t XVar1;
  DOMNode *p;
  DOMNodeImpl *this_00;
  XMLSize_t local_28;
  XMLSize_t i;
  XMLSize_t sz;
  bool deep_local;
  bool readOnl_local;
  DOMAttrMapImpl *this_local;
  
  if ((deep) && (this->fNodes != (DOMNodeVector *)0x0)) {
    XVar1 = DOMNodeVector::size(this->fNodes);
    for (local_28 = 0; local_28 < XVar1; local_28 = local_28 + 1) {
      p = DOMNodeVector::elementAt(this->fNodes,local_28);
      this_00 = xercesc_4_0::castToNodeImpl(p);
      DOMNodeImpl::setReadOnly(this_00,readOnl,deep);
    }
  }
  return;
}

Assistant:

void DOMAttrMapImpl::setReadOnly(bool readOnl, bool deep)
{
    // this->fReadOnly=readOnl;
    if(deep && fNodes!=0)
    {
        XMLSize_t sz = fNodes->size();
        for (XMLSize_t i=0; i<sz; ++i) {
            castToNodeImpl(fNodes->elementAt(i))->setReadOnly(readOnl, deep);
        }
    }
}